

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Max_f32(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  Value *pVVar2;
  float fVar3;
  
  this_00 = &this->super_w3Stack;
  pVVar2 = w3Stack::value(this_00,Tag_f32);
  fVar3 = pVVar2->f32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  pVVar2 = w3Stack::value(this_00,Tag_f32);
  if (fVar3 <= pVVar2->f32) {
    fVar3 = pVVar2->f32;
  }
  pVVar2->f32 = fVar3;
  return;
}

Assistant:

INTERP (Max_f32)
{
    const float z2 = pop_f32 ();
    float& z1 = f32 ();
    z1 = std::max (z1, z2);
}